

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListValueBind<true>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  size_type *psVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  optional_idx error_location;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  bool bVar7;
  reference pvVar8;
  type pEVar9;
  undefined8 *puVar10;
  BinderException *this_00;
  pointer pEVar11;
  long *plVar12;
  ulong *puVar13;
  undefined8 uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  size_type __n;
  size_type __n_00;
  string error;
  string list_arguments;
  LogicalType arg_type;
  element_type *local_170;
  string local_168;
  LogicalType local_148;
  string local_130;
  string local_110;
  string local_f0;
  optional_idx local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  string local_88;
  string local_68;
  LogicalType local_48;
  
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    LogicalType::LogicalType(&local_148,SQLNULL);
  }
  else {
    pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar8);
    ExpressionBinder::GetExpressionReturnType(&local_148,pEVar9);
  }
  if (8 < (ulong)((long)(arguments->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(arguments->
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    __n_00 = 1;
    do {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,__n_00);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar8);
      ExpressionBinder::GetExpressionReturnType(&local_48,pEVar9);
      bVar7 = LogicalType::TryGetMaxLogicalType(context,&local_148,&local_48,&local_148);
      if (!bVar7) {
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Full list: ","");
        local_170 = (element_type *)local_130._M_string_length;
        if ((arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) goto LAB_01b99bfc;
        paVar3 = &local_110.field_2;
        __n = 0;
        goto LAB_01b99d3f;
      }
      LogicalType::~LogicalType(&local_48);
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)((long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  LogicalType::NormalizeType((LogicalType *)&local_130,&local_148);
  _Var6._M_pi = local_148.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar4 = local_148.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_148.id_ = (LogicalTypeId)local_130._M_dataplus._M_p;
  local_148.physical_type_ = local_130._M_dataplus._M_p._1_1_;
  local_148.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_130._M_string_length;
  local_148.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.field_2._M_allocated_capacity;
  local_130._M_string_length = (size_type)peVar4;
  local_130.field_2._M_allocated_capacity = (size_type)_Var6._M_pi;
  LogicalType::~LogicalType((LogicalType *)&local_130);
  if (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs != &local_148) {
    (bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs.id_ = local_148.id_;
    (bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs.physical_type_ =
         local_148.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_,
               &local_148.type_info_);
  }
  LogicalType::LIST((LogicalType *)&local_130,&local_148);
  (bound_function->super_BaseScalarFunction).return_type.id_ =
       (LogicalTypeId)local_130._M_dataplus._M_p;
  (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
       local_130._M_dataplus._M_p._1_1_;
  peVar4 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_130._M_string_length;
  (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.field_2._M_allocated_capacity;
  local_130._M_string_length = (size_type)peVar4;
  local_130.field_2._M_allocated_capacity = (size_type)p_Var5;
  LogicalType::~LogicalType((LogicalType *)&local_130);
  puVar10 = (undefined8 *)operator_new(0x20);
  LogicalType::LogicalType
            ((LogicalType *)&local_130,&(bound_function->super_BaseScalarFunction).return_type);
  *puVar10 = &PTR__VariableReturnBindData_02443d50;
  LogicalType::LogicalType((LogicalType *)(puVar10 + 1),(LogicalType *)&local_130);
  LogicalType::~LogicalType((LogicalType *)&local_130);
  *(undefined8 **)this = puVar10;
  LogicalType::~LogicalType(&local_148);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
LAB_01b99d3f:
  if (__n != 0) {
    ::std::__cxx11::string::append((char *)&local_130);
  }
  if (__n_00 == __n) {
    local_170 = (element_type *)local_130._M_string_length;
  }
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,__n);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar8);
  (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[8])(local_a8,pEVar11);
  plVar12 = (long *)::std::__cxx11::string::append((char *)local_a8);
  puVar13 = (ulong *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_110.field_2._M_allocated_capacity = *puVar13;
    local_110.field_2._8_8_ = plVar12[3];
    local_110._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_110.field_2._M_allocated_capacity = *puVar13;
    local_110._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_110._M_string_length = plVar12[1];
  *plVar12 = (long)puVar13;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,__n);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar8);
  LogicalType::ToString_abi_cxx11_(&local_f0,&pEVar11->return_type);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar3) {
    uVar14 = local_110.field_2._M_allocated_capacity;
  }
  uVar2 = (long)&((_Alloc_hider *)local_110._M_string_length)->_M_p + local_f0._M_string_length;
  in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_110._M_string_length;
  if ((ulong)uVar14 < uVar2) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar14 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < uVar2) goto LAB_01b99e4c;
    puVar10 = (undefined8 *)
              ::std::__cxx11::string::replace
                        ((ulong)&local_f0,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
  }
  else {
LAB_01b99e4c:
    puVar10 = (undefined8 *)
              ::std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0._M_dataplus._M_p)
    ;
  }
  psVar1 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_168.field_2._M_allocated_capacity = *psVar1;
    local_168.field_2._8_8_ = puVar10[3];
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar1;
    local_168._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_168._M_string_length = puVar10[1];
  *puVar10 = psVar1;
  puVar10[1] = 0;
  *(undefined1 *)psVar1 = 0;
  ::std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar3) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  __n = __n + 1;
  if ((ulong)((long)(arguments->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(arguments->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
LAB_01b99bfc:
    local_c8[0] = local_b8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,
               "Cannot unpivot columns of types %s and %s - an explicit cast is required","");
    LogicalType::ToString_abi_cxx11_(&local_68,&local_148);
    LogicalType::ToString_abi_cxx11_(&local_88,&local_48);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (&local_168,(StringUtil *)local_c8,(string *)&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,in_R8)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0]);
    }
    this_00 = (BinderException *)__cxa_allocate_exception(0x10);
    pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,__n_00);
    pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(pvVar8);
    error_location.index = (pEVar11->super_BaseExpression).query_location.index;
    optional_idx::optional_idx(&local_d0,(idx_t)local_170);
    QueryErrorContext::Format(&local_110,&local_130,&local_168,local_d0,false);
    BinderException::BinderException<>(this_00,error_location,&local_110);
    __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  goto LAB_01b99d3f;
}

Assistant:

static unique_ptr<FunctionData> ListValueBind(ClientContext &context, ScalarFunction &bound_function,
                                              vector<unique_ptr<Expression>> &arguments) {
	// collect names and deconflict, construct return type
	LogicalType child_type =
	    arguments.empty() ? LogicalType::SQLNULL : ExpressionBinder::GetExpressionReturnType(*arguments[0]);
	for (idx_t i = 1; i < arguments.size(); i++) {
		auto arg_type = ExpressionBinder::GetExpressionReturnType(*arguments[i]);
		if (!LogicalType::TryGetMaxLogicalType(context, child_type, arg_type, child_type)) {
			if (IS_UNPIVOT) {
				string list_arguments = "Full list: ";
				idx_t error_index = list_arguments.size();
				for (idx_t k = 0; k < arguments.size(); k++) {
					if (k > 0) {
						list_arguments += ", ";
					}
					if (k == i) {
						error_index = list_arguments.size();
					}
					list_arguments += arguments[k]->ToString() + " " + arguments[k]->return_type.ToString();
				}
				auto error =
				    StringUtil::Format("Cannot unpivot columns of types %s and %s - an explicit cast is required",
				                       child_type.ToString(), arg_type.ToString());
				throw BinderException(arguments[i]->GetQueryLocation(),
				                      QueryErrorContext::Format(list_arguments, error, error_index, false));
			} else {
				throw BinderException(arguments[i]->GetQueryLocation(),
				                      "Cannot create a list of types %s and %s - an explicit cast is required",
				                      child_type.ToString(), arg_type.ToString());
			}
		}
	}
	child_type = LogicalType::NormalizeType(child_type);

	// this is more for completeness reasons
	bound_function.varargs = child_type;
	bound_function.return_type = LogicalType::LIST(child_type);
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}